

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtracer.h
# Opt level: O0

void __thiscall spdlog::details::backtracer::~backtracer(backtracer *this)

{
  circular_q<spdlog::details::log_msg_buffer>::~circular_q
            ((circular_q<spdlog::details::log_msg_buffer> *)0x1cb8d2);
  return;
}

Assistant:

class SPDLOG_API backtracer {
    mutable std::mutex mutex_;
    std::atomic<bool> enabled_{false};
    circular_q<log_msg_buffer> messages_;

public:
    backtracer() = default;
    backtracer(const backtracer &other);

    backtracer(backtracer &&other) SPDLOG_NOEXCEPT;
    backtracer &operator=(backtracer other);

    void enable(size_t size);
    void disable();
    bool enabled() const;
    void push_back(const log_msg &msg);
    bool empty() const;

    // pop all items in the q and apply the given fun on each of them.
    void foreach_pop(std::function<void(const details::log_msg &)> fun);
}